

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::AddCommand(Handler *this,string *command,Event *event)

{
  unique_ptr<Event,_std::default_delete<Event>_> local_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>
  local_48;
  Event *local_20;
  Event *event_local;
  string *command_local;
  Handler *this_local;
  
  local_20 = event;
  event_local = (Event *)command;
  command_local = (string *)this;
  std::unique_ptr<Event,std::default_delete<Event>>::unique_ptr<std::default_delete<Event>,void>
            ((unique_ptr<Event,std::default_delete<Event>> *)&local_50,event);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>
  ::pair<std::unique_ptr<Event,_std::default_delete<Event>_>,_true>(&local_48,command,&local_50);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
  ::insert(&this->m_Commands,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>
  ::~pair(&local_48);
  std::unique_ptr<Event,_std::default_delete<Event>_>::~unique_ptr(&local_50);
  return;
}

Assistant:

void Handler::AddCommand(const std::string &command, Event* event) {
    m_Commands.insert({command, std::unique_ptr<Event>(event)});
}